

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_primitives_lib.c
# Opt level: O0

void mem_prim_set32(uint32_t *dp,uint32_t len,uint32_t value)

{
  long lVar1;
  undefined4 in_EDX;
  int in_ESI;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  int local_14;
  undefined4 *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = in_ESI;
  local_10 = in_RDI;
  do {
    if (local_14 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    switch(local_14) {
    case 0xf:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 0xe:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 0xd:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 0xc:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 0xb:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 10:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 9:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 8:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 7:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 6:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 5:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 4:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 3:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 2:
      *local_10 = in_EDX;
      local_10 = local_10 + 1;
    case 1:
      *local_10 = in_EDX;
      local_14 = 0;
      local_10 = local_10 + 1;
      break;
    default:
      *local_10 = in_EDX;
      local_10[1] = in_EDX;
      local_10[2] = in_EDX;
      local_10[3] = in_EDX;
      local_10[4] = in_EDX;
      local_10[5] = in_EDX;
      local_10[6] = in_EDX;
      local_10[7] = in_EDX;
      local_10[8] = in_EDX;
      local_10[9] = in_EDX;
      local_10[10] = in_EDX;
      local_10[0xb] = in_EDX;
      local_10[0xc] = in_EDX;
      local_10[0xd] = in_EDX;
      local_10[0xe] = in_EDX;
      local_10[0xf] = in_EDX;
      local_14 = local_14 + -0x10;
      local_10 = local_10 + 0x10;
    }
  } while( true );
}

Assistant:

void
mem_prim_set32 (uint32_t *dp, uint32_t len, uint32_t value)
{

    while (len != 0) {

        switch (len) {
        /*
         * Here we do blocks of 8.  Once the remaining count
         * drops below 8, take the fast track to finish up.
         */
        default:
            *dp++ = value; *dp++ = value; *dp++ = value; *dp++ = value;
            *dp++ = value; *dp++ = value; *dp++ = value; *dp++ = value;
            *dp++ = value; *dp++ = value; *dp++ = value; *dp++ = value;
            *dp++ = value; *dp++ = value; *dp++ = value; *dp++ = value;
            len -= 16;
            break;

        case 15:  *dp++ = value;
        case 14:  *dp++ = value;
        case 13:  *dp++ = value;
        case 12:  *dp++ = value;
        case 11:  *dp++ = value;
        case 10:  *dp++ = value;
        case 9:  *dp++ = value;
        case 8:  *dp++ = value;

        case 7:  *dp++ = value;
        case 6:  *dp++ = value;
        case 5:  *dp++ = value;
        case 4:  *dp++ = value;
        case 3:  *dp++ = value;
        case 2:  *dp++ = value;
        case 1:  *dp++ = value;
            len = 0;
            break;
        }
    } /* end while */

    return;
}